

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O2

string * __thiscall
just::temp::directory::dir_t::next_file_abi_cxx11_(string *__return_storage_ptr__,dir_t *this)

{
  byte bVar1;
  bool bVar2;
  dirent *pdVar3;
  string f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = this->_eod;
  if ((bool)bVar1 == false) {
    pdVar3 = readdir((DIR *)this->_d);
    if (pdVar3 != (dirent *)0x0) {
      std::__cxx11::string::assign((char *)&local_30);
      bVar1 = this->_eod;
      goto LAB_001054e0;
    }
    this->_eod = true;
  }
  else {
LAB_001054e0:
    if ((bVar1 & 1) == 0) {
      bVar2 = std::operator==(&local_30,".");
      if (!bVar2) {
        bVar2 = std::operator==(&local_30,"..");
        if (!bVar2) goto LAB_00105520;
      }
      next_file_abi_cxx11_(__return_storage_ptr__,this);
      goto LAB_0010552d;
    }
  }
LAB_00105520:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
LAB_0010552d:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string next_file()
        {
          std::string f;
          if (!_eod)
          {
#ifdef _WIN32
            if (_next_eod)
            {
              _eod = true;
            }
            else
            {
              f = _data.cFileName;
              _next_eod = !FindNextFile(_d, &_data);
            }
#else
            if (dirent* d = readdir(_d))
            {
              f = d->d_name;
            }
            else
            {
              _eod = true;
            }
#endif
          }

          return (!_eod && (f == "." || f == "..")) ? next_file() : f;
        }